

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O1

void __thiscall
Diligent::SerializedPipelineStateImpl::
SerializedPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,IReferenceCounters *pRefCounters,
          SerializationDeviceImpl *pDevice,TilePipelineStateCreateInfo *CreateInfo,
          PipelineStateArchiveInfo *ArchiveInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Char *pCVar6;
  IThreadPool *pThreadPool;
  undefined8 __p;
  pointer pSVar7;
  pointer ppSVar8;
  size_t sVar9;
  SerializedShaderStageInfo *Stage;
  pointer pSVar10;
  pointer ppSVar11;
  char *pcVar12;
  SerializedPipelineStateImpl *pSVar13;
  RefCntAutoPtr<Diligent::IAsyncTask> pCompileTask;
  vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  Shaders;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  ShaderCompileTasks;
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ShaderStages;
  SHADER_TYPE ActiveShaderStages;
  AsyncInitializer local_280;
  unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  *local_268;
  SerializedPipelineStateImpl *local_260;
  vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  local_258;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  local_238;
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  local_218;
  string *local_200;
  TilePipelineStateCreateInfo *local_1f8;
  PipelineStateArchiveInfo *local_1f0;
  pointer local_1e8;
  SHADER_TYPE local_1dc;
  anon_class_424_4_54625c31_for_Handler local_1d8;
  
  RefCountedObject<Diligent::ISerializedPipelineState>::RefCountedObject<>
            ((RefCountedObject<Diligent::ISerializedPipelineState> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::ISerializedPipelineState>).
  super_RefCountedObject<Diligent::ISerializedPipelineState>.super_ISerializedPipelineState.
  super_IPipelineState.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00afd910;
  this->m_pSerializationDevice = pDevice;
  (this->m_Data).Aux.NoShaderReflection = false;
  local_280.m_wpTask.m_pRefCounters = (RefCountersImpl *)pDevice;
  memset(&(this->m_Data).Common,0,0xc9);
  pCVar6 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
  pcVar12 = "";
  if (pCVar6 != (Char *)0x0) {
    pcVar12 = pCVar6;
  }
  paVar1 = &(this->m_Name).field_2;
  (this->m_Name)._M_dataplus._M_p = (pointer)paVar1;
  sVar9 = strlen(pcVar12);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_Name,pcVar12,pcVar12 + sVar9);
  local_1d8.this =
       *(SerializedPipelineStateImpl **)
        &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  local_1d8.Shaders.
  super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ImmediateContextMask;
  uVar2 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x3;
  uVar3 = *(undefined2 *)
           &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1;
  local_218.
  super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(CONCAT51(local_218.
                                  super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start._3_5_,uVar2),uVar3);
  uVar4 = *(undefined4 *)
           &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0xc;
  uVar5 = *(undefined4 *)
           &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1c;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (this->m_Name)._M_dataplus._M_p;
  *(SerializedPipelineStateImpl **)&(this->m_Desc).PipelineType = local_1d8.this;
  (this->m_Desc).ImmediateContextMask =
       (Uint64)local_1d8.Shaders.
               super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (this->m_Desc).ResourceLayout.DefaultVariableType = SHADER_RESOURCE_VARIABLE_TYPE_STATIC;
  (this->m_Desc).ResourceLayout.field_0x3 = uVar2;
  *(undefined2 *)&(this->m_Desc).ResourceLayout.field_0x1 = uVar3;
  (this->m_Desc).ResourceLayout.DefaultVariableMergeStages = SHADER_TYPE_UNKNOWN;
  (this->m_Desc).ResourceLayout.NumVariables = 0;
  *(undefined4 *)&(this->m_Desc).ResourceLayout.field_0xc = uVar4;
  (this->m_Desc).ResourceLayout.Variables = (ShaderResourceVariableDesc *)0x0;
  (this->m_Desc).ResourceLayout.NumImmutableSamplers = 0;
  *(undefined4 *)&(this->m_Desc).ResourceLayout.field_0x1c = uVar5;
  (this->m_Desc).ResourceLayout.ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  (this->m_AsyncInitializer)._M_t.
  super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
  .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl = (AsyncInitializer *)0x0
  ;
  (this->m_pRenderPass).m_pObject = (IRenderPass *)0x0;
  (this->m_pDefaultSignature).m_pObject = (SerializedResourceSignatureImpl *)0x0;
  (this->m_Signatures).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Signatures).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_Signatures).
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_Signatures).
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  pcVar12 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
  if ((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) {
    LogError<true,char[54]>
              (false,"SerializedPipelineStateImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x173,(char (*) [54])"Serialized pipeline state name can\'t be null or empty");
  }
  anon_unknown_126::ValidatePipelineStateArchiveInfo
            (&CreateInfo->super_PipelineStateCreateInfo,ArchiveInfo,
             *(ARCHIVE_DEVICE_DATA_FLAGS *)((long)local_280.m_wpTask.m_pRefCounters + 0x1c40));
  ValidatePSOCreateInfo<Diligent::TilePipelineStateCreateInfo>
            ((IRenderDevice *)local_280.m_wpTask.m_pRefCounters,CreateInfo);
  LOCK();
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_COMPILING;
  UNLOCK();
  if ((((CreateInfo->super_PipelineStateCreateInfo).Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) ==
       PSO_CREATE_FLAG_NONE) ||
     ((((RenderDeviceBase<Diligent::SerializationEngineImplTraits> *)
       &(local_280.m_wpTask.m_pRefCounters)->super_IReferenceCounters)->
      m_pShaderCompilationThreadPool).m_pObject == (IThreadPool *)0x0)) {
    Initialize<Diligent::TilePipelineStateCreateInfo>(this,CreateInfo,ArchiveInfo);
    LOCK();
    (this->m_Status)._M_i = PIPELINE_STATE_STATUS_READY;
    UNLOCK();
  }
  else {
    local_218.
    super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.
    super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1dc = SHADER_TYPE_UNKNOWN;
    local_280.m_wpTask.m_pObject = (IAsyncTask *)paVar1;
    local_268 = &this->m_AsyncInitializer;
    local_260 = this;
    local_200 = &this->m_Name;
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::SerializedShaderStageInfo,std::allocator<Diligent::SerializedShaderStageInfo>>>
              (CreateInfo,&local_218,false,&local_1dc);
    pSVar7 = local_218.
             super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_258.
    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_218.
        super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_218.
        super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pSVar10 = local_218.
                super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<Diligent::SerializedShaderImpl_const*const*,std::vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>>>
                  ((vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>
                    *)&local_258,
                   local_258.
                   super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (pSVar10->Shaders).
                   super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pSVar10->Shaders).
                   super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        pSVar10 = pSVar10 + 1;
      } while (pSVar10 != pSVar7);
    }
    local_238.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (RefCntAutoPtr<Diligent::IAsyncTask> *)0x0;
    local_238.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (RefCntAutoPtr<Diligent::IAsyncTask> *)0x0;
    local_1e8 = local_258.
                super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_1f8 = CreateInfo;
    local_1f0 = ArchiveInfo;
    if (local_258.
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_258.
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppSVar11 = local_258.
                 super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        SerializedShaderImpl::GetCompileTasks
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                    *)&local_1d8,*ppSVar11);
        ppSVar8 = local_1d8.Shaders.
                  super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (pSVar13 = local_1d8.this; pSVar13 != (SerializedPipelineStateImpl *)ppSVar8;
            pSVar13 = (SerializedPipelineStateImpl *)
                      &(pSVar13->super_ObjectBase<Diligent::ISerializedPipelineState>).
                       super_RefCountedObject<Diligent::ISerializedPipelineState>.m_pRefCounters) {
          local_280._0_8_ =
               (pSVar13->super_ObjectBase<Diligent::ISerializedPipelineState>).
               super_RefCountedObject<Diligent::ISerializedPipelineState>.
               super_ISerializedPipelineState.super_IPipelineState.super_IDeviceObject.super_IObject
               ._vptr_IObject;
          if ((pointer)local_280._0_8_ != (pointer)0x0) {
            (**(code **)(*(_func_int **)local_280._0_8_ + 8))();
          }
          if (local_238.
              super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_238.
              super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
            ::_M_realloc_insert<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>
                      ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
                        *)&local_238,
                       (iterator)
                       local_238.
                       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (RefCntAutoPtr<Diligent::IAsyncTask> *)&local_280);
          }
          else {
            (local_238.
             super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->m_pObject = (IAsyncTask *)local_280._0_8_;
            local_280._0_8_ =
                 (__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                  )0x0;
            local_238.
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_238.
                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if ((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
               )local_280._0_8_ !=
              (__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
               )0x0) {
            (**(code **)(*(_func_int **)local_280._0_8_ + 0x10))();
            local_280._0_8_ =
                 (__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                  )0x0;
          }
        }
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
        ::~vector((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                   *)&local_1d8);
        ppSVar11 = ppSVar11 + 1;
      } while (ppSVar11 != local_1e8);
    }
    pThreadPool = (((RenderDeviceBase<Diligent::SerializationEngineImplTraits> *)
                   &(local_280.m_wpTask.m_pRefCounters)->super_IReferenceCounters)->
                  m_pShaderCompilationThreadPool).m_pObject;
    local_1d8.this = local_260;
    std::
    vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ::vector(&local_1d8.Shaders,&local_258);
    TilePipelineStateCreateInfoX::TilePipelineStateCreateInfoX(&local_1d8.CreateInfo,local_1f8);
    local_1d8.ArchiveInfo = *local_1f0;
    AsyncInitializer::
    Start<Diligent::SerializedPipelineStateImpl::SerializedPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>(Diligent::IReferenceCounters*,Diligent::SerializationDeviceImpl*,Diligent::TilePipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)::_lambda(unsigned_int)_1_>
              (&local_280,pThreadPool,&local_238,&local_1d8);
    __p = local_280._0_8_;
    local_280._0_8_ =
         (__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
          )0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)local_268,(pointer)__p);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&local_280);
    SerializedPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>(Diligent::IReferenceCounters*,Diligent::SerializationDeviceImpl*,Diligent::TilePipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(unsigned_int)#1}::~PipelineStateArchiveInfo((_lambda_unsigned_int__1_ *)&local_1d8);
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ::~vector(&local_238);
    if (local_258.
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.
                      super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.
                            super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.
                            super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ::~vector(&local_218);
  }
  return;
}

Assistant:

SerializedPipelineStateImpl::SerializedPipelineStateImpl(IReferenceCounters*             pRefCounters,
                                                         SerializationDeviceImpl*        pDevice,
                                                         const PSOCreateInfoType&        CreateInfo,
                                                         const PipelineStateArchiveInfo& ArchiveInfo) :
    TBase{pRefCounters},
    m_pSerializationDevice{pDevice},
    m_Name{CreateInfo.PSODesc.Name != nullptr ? CreateInfo.PSODesc.Name : ""},
    m_Desc //
    {
        [this](PipelineStateDesc Desc) //
        {
            Desc.Name = m_Name.c_str();
            // We don't need resource layout and we don't copy variables and immutable samplers
            Desc.ResourceLayout = {};
            return Desc;
        }(CreateInfo.PSODesc) //
    },
    m_pRenderPass{RenderPassFromCI(CreateInfo)}
{
    if (CreateInfo.PSODesc.Name == nullptr || CreateInfo.PSODesc.Name[0] == '\0')
        LOG_ERROR_AND_THROW("Serialized pipeline state name can't be null or empty");

    ValidatePipelineStateArchiveInfo(CreateInfo, ArchiveInfo, pDevice->GetSupportedDeviceFlags());
    ValidatePSOCreateInfo(pDevice, CreateInfo);

    m_Status.store(PIPELINE_STATE_STATUS_COMPILING);
    if ((CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0 && pDevice->GetShaderCompilationThreadPool() != nullptr)
    {
        // Collect all asynchronous shader compile tasks
        std::vector<SerializedShaderStageInfo> ShaderStages;
        SHADER_TYPE                            ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
        constexpr bool                         WaitUntilShadersReady = false;
        PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

        std::vector<const SerializedShaderImpl*> Shaders;
        for (const SerializedShaderStageInfo& Stage : ShaderStages)
        {
            Shaders.insert(Shaders.end(), Stage.Shaders.begin(), Stage.Shaders.end());
        }

        std::vector<RefCntAutoPtr<IAsyncTask>> ShaderCompileTasks;
        for (const SerializedShaderImpl* pShader : Shaders)
        {
            for (RefCntAutoPtr<IAsyncTask> pCompileTask : pShader->GetCompileTasks())
                ShaderCompileTasks.emplace_back(std::move(pCompileTask));
        }

        m_AsyncInitializer = AsyncInitializer::Start(
            pDevice->GetShaderCompilationThreadPool(),
            ShaderCompileTasks, // Make sure that all asynchronous shader compile tasks are completed first
            [this,
#ifdef DILIGENT_DEBUG
             Shaders,
#endif
             CreateInfo = typename PipelineStateCreateInfoXTraits<PSOCreateInfoType>::CreateInfoXType{CreateInfo},
             ArchiveInfo](Uint32 ThreadId) mutable //
            {
#ifdef DILIGENT_DEBUG
                for (const SerializedShaderImpl* pShader : Shaders)
                {
                    VERIFY(!pShader->IsCompiling(), "All shader compile tasks must have been completed since we used them as "
                                                    "prerequisites for the pipeline initialization task. This appears to be a bug.");
                }
#endif
                try
                {
                    Initialize(static_cast<const PSOCreateInfoType&>(CreateInfo), ArchiveInfo);
                    m_Status.store(PIPELINE_STATE_STATUS_READY);
                }
                catch (...)
                {
                    m_Status.store(PIPELINE_STATE_STATUS_FAILED);
                }

                // Release create info objects
                CreateInfo.Clear();
            });
    }
    else
    {
        Initialize(static_cast<const PSOCreateInfoType&>(CreateInfo), ArchiveInfo);
        m_Status.store(PIPELINE_STATE_STATUS_READY);
    }
}